

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImRect::Add(ImRect *this,ImRect *r)

{
  float *pfVar1;
  float fVar2;
  ImRect *r_local;
  ImRect *this_local;
  
  fVar2 = (this->Min).x;
  if ((r->Min).x <= fVar2 && fVar2 != (r->Min).x) {
    (this->Min).x = (r->Min).x;
  }
  fVar2 = (this->Min).y;
  pfVar1 = &(r->Min).y;
  if (*pfVar1 <= fVar2 && fVar2 != *pfVar1) {
    (this->Min).y = (r->Min).y;
  }
  if ((this->Max).x < (r->Max).x) {
    (this->Max).x = (r->Max).x;
  }
  if ((this->Max).y < (r->Max).y) {
    (this->Max).y = (r->Max).y;
  }
  return;
}

Assistant:

void        Add(const ImRect& r)                { if (Min.x > r.Min.x) Min.x = r.Min.x; if (Min.y > r.Min.y) Min.y = r.Min.y; if (Max.x < r.Max.x) Max.x = r.Max.x; if (Max.y < r.Max.y) Max.y = r.Max.y; }